

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O0

void Acb_ObjCollectTfi_rec(Acb_Ntk_t *p,int iObj,int fTerm)

{
  int iVar1;
  int *piVar2;
  int local_28;
  int i;
  int iFanin;
  int *pFanin;
  int fTerm_local;
  int iObj_local;
  Acb_Ntk_t *p_local;
  
  iVar1 = Acb_ObjSetTravIdCur(p,iObj);
  if ((iVar1 == 0) && ((fTerm != 0 || (iVar1 = Acb_ObjIsCi(p,iObj), iVar1 == 0)))) {
    local_28 = 0;
    piVar2 = Acb_ObjFanins(p,iObj);
    for (; local_28 < *piVar2; local_28 = local_28 + 1) {
      Acb_ObjCollectTfi_rec(p,piVar2[local_28 + 1],fTerm);
    }
    Vec_IntPush(&p->vArray0,iObj);
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////


////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Collecting TFI and TFO.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Acb_ObjCollectTfi_rec( Acb_Ntk_t * p, int iObj, int fTerm )
{
    int * pFanin, iFanin, i;
    if ( Acb_ObjSetTravIdCur(p, iObj) )
        return;
    if ( !fTerm && Acb_ObjIsCi(p, iObj) )
        return;
    Acb_ObjForEachFaninFast( p, iObj, pFanin, iFanin, i )
        Acb_ObjCollectTfi_rec( p, iFanin, fTerm );
    Vec_IntPush( &p->vArray0, iObj );
}